

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

Buffer * ReadFile(Buffer *__return_storage_ptr__,char *filename)

{
  size_type __n;
  runtime_error *prVar1;
  allocator local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ifstream file;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&file,filename,_S_in|_S_bin|_S_ate);
  if ((abStack_208[*(long *)(_file + -0x18)] & 5) != 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_268,"Failed to open file \"",&local_289);
    std::operator+(&local_248,&local_268,filename);
    std::operator+(&local_288,&local_248,"\".");
    std::runtime_error::runtime_error(prVar1,(string *)&local_288);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __n = std::istream::tellg();
  std::istream::seekg((long)&file,_S_beg);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_288);
  std::istream::read((char *)&file,
                     (long)(__return_storage_ptr__->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
  if ((abStack_208[*(long *)(_file + -0x18)] & 1) == 0) {
    std::ifstream::~ifstream(&file);
    return __return_storage_ptr__;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar1,"Failed to read file.");
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Buffer ReadFile(const char* filename) {
  std::ifstream file(filename, std::ios::binary | std::ios::in | std::ios::ate);
  if (!file) {
    throw Error(std::string("Failed to open file \"") + filename + "\".");
  }

  std::streamsize size = file.tellg();
  file.seekg(0, std::ios::beg);

  Buffer data(size);
  file.read(reinterpret_cast<char*>(data.data()), data.size());

  if (file.bad()) {
    throw Error("Failed to read file.");
  }

  return data;
}